

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayoutPrivate::identifyFloatItems
          (QGraphicsAnchorLayoutPrivate *this,QSet<QtGraphicsAnchorLayout::AnchorData_*> *visited,
          Orientation orientation)

{
  Span *pSVar1;
  QGraphicsLayoutItem **ppQVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  QGraphicsLayoutItem *item;
  QGraphicsLayoutItem *local_60;
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue> local_58;
  piter local_50;
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (Data *)0x0;
  local_50 = (piter)QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::begin
                              (&visited->q_hash);
  while( true ) {
    if (local_50.d ==
        (Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>_> *)0x0 &&
        local_50.bucket == 0) break;
    pSVar1 = (local_50.d)->spans;
    uVar5 = local_50.bucket >> 7;
    identifyNonFloatItems_helper
              (this,*(AnchorData **)
                     pSVar1[uVar5].entries[pSVar1[uVar5].offsets[(uint)local_50.bucket & 0x7f]].
                     storage.data,(QSet<QGraphicsLayoutItem_*> *)&local_40);
    QHashPrivate::
    iterator<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>_>::operator++
              (&local_50);
  }
  local_58.d = (Data *)0x0;
  ppQVar2 = (this->items).d.ptr;
  lVar3 = (this->items).d.size;
  for (lVar6 = 0; lVar3 << 3 != lVar6; lVar6 = lVar6 + 8) {
    local_60 = *(QGraphicsLayoutItem **)((long)ppQVar2 + lVar6);
    bVar4 = QHash<QGraphicsLayoutItem_*,_QHashDummyValue>::contains(&local_40,&local_60);
    if (!bVar4) {
      QSet<QGraphicsLayoutItem_*>::insert
                ((QSet<QGraphicsLayoutItem_*> *)&local_50,(QGraphicsLayoutItem **)&local_58);
    }
  }
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue>::operator=
            ((QHash<QGraphicsLayoutItem_*,_QHashDummyValue> *)
             (&this->graphHasConflicts + (long)(int)orientation * 4),&local_58);
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue>::~QHash(&local_58);
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::identifyFloatItems(const QSet<AnchorData *> &visited, Qt::Orientation orientation)
{
    QSet<QGraphicsLayoutItem *> nonFloating;

    for (const AnchorData *ad : visited)
        identifyNonFloatItems_helper(ad, &nonFloating);

    QSet<QGraphicsLayoutItem *> floatItems;
    for (QGraphicsLayoutItem *item : std::as_const(items)) {
        if (!nonFloating.contains(item))
            floatItems.insert(item);
    }
    m_floatItems[orientation] = std::move(floatItems);
}